

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O0

void * CRYPTO_get_thread_local(thread_local_data_t index)

{
  void *pvVar1;
  void **pointers;
  void *pvStack_10;
  thread_local_data_t index_local;
  
  CRYPTO_once(&g_thread_local_init_once,thread_local_init);
  if (g_thread_local_key_created == 0) {
    pvStack_10 = (void *)0x0;
  }
  else {
    pvVar1 = pthread_getspecific(g_thread_local_key);
    if (pvVar1 == (void *)0x0) {
      pvStack_10 = (void *)0x0;
    }
    else {
      pvStack_10 = *(void **)((long)pvVar1 + (ulong)index * 8);
    }
  }
  return pvStack_10;
}

Assistant:

void *CRYPTO_get_thread_local(thread_local_data_t index) {
  CRYPTO_once(&g_thread_local_init_once, thread_local_init);
  if (!g_thread_local_key_created) {
    return NULL;
  }

  void **pointers =
      reinterpret_cast<void **>(pthread_getspecific(g_thread_local_key));
  if (pointers == NULL) {
    return NULL;
  }
  return pointers[index];
}